

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t
spvtools::val::StructuredSwitchChecks
          (ValidationState_t *_,Function *function,Instruction *switch_inst,BasicBlock *header,
          BasicBlock *merge)

{
  uint32_t uVar1;
  ValidationState_t *pVVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  uint uVar5;
  spv_result_t sVar6;
  uint uVar7;
  iterator iVar8;
  BasicBlock *other;
  iterator __pos;
  ulong uVar9;
  _Base_ptr p_Var10;
  Instruction *inst;
  ulong index;
  ulong uVar11;
  ulong uVar12;
  uint32_t uVar13;
  ulong index_00;
  pair<spvtools::val::BasicBlock_*,_bool> pVar14;
  uint32_t case_fall_through;
  uint32_t target_1;
  uint32_t local_318;
  uint local_314;
  ValidationState_t *local_310;
  BasicBlock *local_308;
  uint local_2fc;
  Function *local_2f8;
  BasicBlock *local_2f0;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  num_fall_through_targeted;
  string local_2b8;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  seen_to_fall_through;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  case_targets;
  string local_228;
  uint32_t target;
  int iStack_204;
  spv_result_t local_38;
  
  case_targets._M_h._M_buckets = &case_targets._M_h._M_single_bucket;
  case_targets._M_h._M_bucket_count = 1;
  case_targets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  case_targets._M_h._M_element_count = 0;
  case_targets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  case_targets._M_h._M_rehash_policy._M_next_resize = 0;
  case_targets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_310 = _;
  local_308 = header;
  local_2f8 = function;
  for (uVar11 = 1;
      uVar11 < (ulong)((long)(switch_inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(switch_inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar11 = (ulong)((int)uVar11 + 2)) {
    uVar5 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar11);
    target = uVar5;
    if (uVar5 != merge->id_) {
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&case_targets,&target);
    }
  }
  num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header;
  num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0 = merge;
  num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2fc = Instruction::GetOperandAs<unsigned_int>(switch_inst,1);
  uVar11 = 3;
  do {
    index = uVar11;
    uVar12 = (long)(switch_inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(switch_inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar12 <= index) break;
    uVar5 = Instruction::GetOperandAs<unsigned_int>(switch_inst,index);
    uVar11 = (ulong)((int)index + 2);
  } while (local_2fc != uVar5);
  seen_to_fall_through._M_h._M_buckets = &seen_to_fall_through._M_h._M_single_bucket;
  seen_to_fall_through._M_h._M_bucket_count = 1;
  seen_to_fall_through._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_to_fall_through._M_h._M_element_count = 0;
  seen_to_fall_through._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_to_fall_through._M_h._M_rehash_policy._M_next_resize = 0;
  seen_to_fall_through._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar13 = 0;
  uVar5 = 3;
  for (uVar11 = 1;
      uVar11 < (ulong)((long)(switch_inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(switch_inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar11 = (ulong)((int)uVar11 + 2)) {
    target_1 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar11);
    if (target_1 != local_2f0->id_) {
      case_fall_through = 0;
      iVar8 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&seen_to_fall_through._M_h,&target_1);
      local_318 = uVar13;
      if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        pVar14 = Function::GetBlock(local_2f8,target_1);
        other = pVar14.first;
        if (((local_308->structurally_reachable_ != true) ||
            (other->structurally_reachable_ != true)) ||
           (bVar4 = BasicBlock::structurally_dominates(local_308,other), pBVar3 = local_308,
           pVVar2 = local_310, bVar4)) {
          sVar6 = FindCaseFallThrough(local_310,other,&case_fall_through,local_2f0,&case_targets,
                                      local_2f8);
          if (sVar6 == SPV_SUCCESS) {
            if (case_fall_through == 0) {
              uVar9 = 0;
            }
            else {
              __pos = std::
                      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::lower_bound(&num_fall_through_targeted._M_t,&case_fall_through);
              uVar9 = (ulong)case_fall_through;
              if (((_Rb_tree_header *)__pos._M_node ==
                   &num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header) ||
                 (__pos._M_node[1]._M_color != case_fall_through)) {
                _target = (pair<unsigned_int,_int>)(uVar9 | 0x100000000);
                std::
                _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                ::_M_emplace_hint_unique<std::pair<unsigned_int,int>>
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                            *)&num_fall_through_targeted,(const_iterator)__pos._M_node,
                           (pair<unsigned_int,_int> *)&target);
                uVar9 = (ulong)case_fall_through;
              }
              else {
                *(int *)&__pos._M_node[1].field_0x4 = *(int *)&__pos._M_node[1].field_0x4 + 1;
              }
            }
            _target = (pair<unsigned_int,_int>)(uVar9 << 0x20 | (ulong)target_1);
            std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&seen_to_fall_through,&target);
            goto LAB_001a63cf;
          }
          goto LAB_001a65af;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&target,local_310,SPV_ERROR_INVALID_CFG,local_308->label_);
        std::operator<<((ostream *)&target,"Switch header ");
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,pVVar2,pBVar3->id_);
        std::operator<<((ostream *)&target,(string *)&local_2b8);
        std::operator<<((ostream *)&target," does not structurally dominate its case construct ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,pVVar2,target_1);
        std::operator<<((ostream *)&target,(string *)&local_228);
LAB_001a6590:
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        sVar6 = local_38;
        goto LAB_001a65aa;
      }
      case_fall_through =
           *(uint32_t *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur + 0xc);
LAB_001a63cf:
      if ((uVar12 <= index) && (case_fall_through == local_2fc)) {
        case_fall_through = local_318;
      }
      uVar13 = local_318;
      local_314 = uVar5;
      if ((case_fall_through != 0) && (uVar13 = case_fall_through, (int)uVar11 != 1)) {
        do {
          uVar13 = target_1;
          index_00 = (ulong)uVar5;
          uVar9 = (long)(switch_inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(switch_inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
          if (uVar9 <= index_00) goto LAB_001a642e;
          uVar7 = Instruction::GetOperandAs<unsigned_int>(switch_inst,index_00);
          uVar5 = uVar5 + 2;
        } while (uVar13 == uVar7);
        uVar9 = (long)(switch_inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(switch_inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
LAB_001a642e:
        uVar1 = case_fall_through;
        if ((uVar9 < index_00) ||
           (uVar7 = Instruction::GetOperandAs<unsigned_int>(switch_inst,index_00),
           uVar13 = local_318, uVar5 = local_314, uVar1 != uVar7)) {
          pVVar2 = local_310;
          ValidationState_t::diag
                    ((DiagnosticStream *)&target,local_310,SPV_ERROR_INVALID_CFG,switch_inst);
          std::operator<<((ostream *)&target,"Case construct that targets ");
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,pVVar2,target_1);
          std::operator<<((ostream *)&target,(string *)&local_2b8);
          std::operator<<((ostream *)&target," has branches to the case construct that targets ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,pVVar2,case_fall_through);
          std::operator<<((ostream *)&target,(string *)&local_228);
          std::operator<<((ostream *)&target,
                          ", but does not immediately precede it in the OpSwitch\'s target list");
          goto LAB_001a6590;
        }
      }
    }
    uVar5 = uVar5 + 2;
  }
  p_Var10 = num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pVVar2 = local_310;
    if ((_Rb_tree_header *)p_Var10 == &num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header)
    {
      sVar6 = SPV_SUCCESS;
LAB_001a65af:
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&seen_to_fall_through._M_h);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&num_fall_through_targeted._M_t);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&case_targets._M_h);
      return sVar6;
    }
    if (1 < *(uint *)&p_Var10[1].field_0x4) {
      inst = ValidationState_t::FindDef(local_310,p_Var10[1]._M_color);
      ValidationState_t::diag((DiagnosticStream *)&target,pVVar2,SPV_ERROR_INVALID_CFG,inst);
      std::operator<<((ostream *)&target,
                      "Multiple case constructs have branches to the case construct that targets ");
      ValidationState_t::getIdName_abi_cxx11_(&local_2b8,pVVar2,p_Var10[1]._M_color);
      std::operator<<((ostream *)&target,(string *)&local_2b8);
      std::__cxx11::string::_M_dispose();
      sVar6 = local_38;
LAB_001a65aa:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&target);
      goto LAB_001a65af;
    }
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}